

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_opt.c
# Opt level: O0

void ZSTD_setBasePrices(optState_t *optPtr,int optLevel)

{
  int iVar1;
  U32 local_24;
  U32 local_20;
  U32 local_1c;
  U32 local_18;
  int optLevel_local;
  optState_t *optPtr_local;
  
  iVar1 = ZSTD_compressedLiterals(optPtr);
  if (iVar1 != 0) {
    if (optLevel == 0) {
      local_18 = ZSTD_bitWeight(optPtr->litSum);
    }
    else {
      local_18 = ZSTD_fracWeight(optPtr->litSum);
    }
    optPtr->litSumBasePrice = local_18;
  }
  if (optLevel == 0) {
    local_1c = ZSTD_bitWeight(optPtr->litLengthSum);
  }
  else {
    local_1c = ZSTD_fracWeight(optPtr->litLengthSum);
  }
  optPtr->litLengthSumBasePrice = local_1c;
  if (optLevel == 0) {
    local_20 = ZSTD_bitWeight(optPtr->matchLengthSum);
  }
  else {
    local_20 = ZSTD_fracWeight(optPtr->matchLengthSum);
  }
  optPtr->matchLengthSumBasePrice = local_20;
  if (optLevel == 0) {
    local_24 = ZSTD_bitWeight(optPtr->offCodeSum);
  }
  else {
    local_24 = ZSTD_fracWeight(optPtr->offCodeSum);
  }
  optPtr->offCodeSumBasePrice = local_24;
  return;
}

Assistant:

static void ZSTD_setBasePrices(optState_t* optPtr, int optLevel)
{
    if (ZSTD_compressedLiterals(optPtr))
        optPtr->litSumBasePrice = WEIGHT(optPtr->litSum, optLevel);
    optPtr->litLengthSumBasePrice = WEIGHT(optPtr->litLengthSum, optLevel);
    optPtr->matchLengthSumBasePrice = WEIGHT(optPtr->matchLengthSum, optLevel);
    optPtr->offCodeSumBasePrice = WEIGHT(optPtr->offCodeSum, optLevel);
}